

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

void Cbs2_ManCleanWatch(Cbs2_Man_t *p)

{
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < (p->vWatchUpds).nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(&p->vWatchUpds,i_00);
    Vec_IntWriteEntry(&p->vWatches,i,0);
  }
  (p->vWatchUpds).nSize = 0;
  return;
}

Assistant:

static inline void Cbs2_ManCleanWatch( Cbs2_Man_t * p )
{
    int i, iLit;
    Vec_IntForEachEntry( &p->vWatchUpds, iLit, i )
        Vec_IntWriteEntry( &p->vWatches, iLit, 0 );
    Vec_IntClear( &p->vWatchUpds );
    //Vec_IntForEachEntry( &p->vWatches, iLit, i )
    //    assert( iLit == 0 );
}